

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::decode(jpeg_decoder *this,void **pScan_line,uint *pScan_line_len)

{
  bool bVar1;
  uint32_t uVar2;
  int *in_RDX;
  undefined8 *in_RSI;
  jpeg_decoder *in_RDI;
  bool bVar3;
  jpeg_decoder *unaff_retaddr;
  jpeg_decoder *in_stack_00000010;
  int status;
  bool got_mcu_early;
  bool get_another_mcu_row;
  bool chroma_y_filtering;
  jpeg_decoder *in_stack_00000050;
  jpeg_decoder *in_stack_00000070;
  jpeg_decoder *in_stack_000001e8;
  undefined7 in_stack_ffffffffffffffc8;
  bool bVar4;
  jpeg_decoder *this_00;
  int local_4;
  
  if ((in_RDI->m_error_code == JPGD_SUCCESS) && ((in_RDI->m_ready_flag & 1U) != 0)) {
    if (in_RDI->m_total_lines_left == 0) {
      local_4 = 1;
    }
    else {
      bVar4 = false;
      if (((in_RDI->m_flags & 1) != 0) &&
         (((in_RDI->m_scan_type == 4 || (bVar4 = false, in_RDI->m_scan_type == 3)) &&
          (bVar4 = false, 1 < in_RDI->m_image_x_size)))) {
        bVar4 = 1 < in_RDI->m_image_y_size;
      }
      bVar3 = false;
      bVar1 = false;
      if (bVar4 == false) {
        bVar3 = in_RDI->m_mcu_lines_left == 0;
      }
      else if (in_RDI->m_total_lines_left == in_RDI->m_image_y_size) {
        bVar3 = true;
      }
      else if ((in_RDI->m_mcu_lines_left == 1) && (1 < in_RDI->m_total_lines_left)) {
        bVar3 = true;
        bVar1 = true;
      }
      this_00 = in_RDI;
      if ((!bVar3) ||
         (local_4 = decode_next_mcu_row((jpeg_decoder *)CONCAT17(bVar4,in_stack_ffffffffffffffc8)),
         local_4 == 0)) {
        switch(in_RDI->m_scan_type) {
        case 0:
          gray_convert(in_RDI);
          *in_RSI = in_RDI->m_pScan_line_0;
          break;
        case 1:
          H1V1Convert(this_00);
          *in_RSI = in_RDI->m_pScan_line_0;
          break;
        case 2:
          if ((((in_RDI->m_flags & 1) == 0) || (in_RDI->m_image_x_size < 2)) ||
             (in_RDI->m_image_y_size < 2)) {
            H2V1Convert(unaff_retaddr);
          }
          else {
            H2V1ConvertFiltered(in_stack_00000050);
          }
          *in_RSI = in_RDI->m_pScan_line_0;
          break;
        case 3:
          if (bVar4 == false) {
            if ((in_RDI->m_mcu_lines_left & 1U) == 0) {
              H1V2Convert(unaff_retaddr);
              *in_RSI = in_RDI->m_pScan_line_0;
            }
            else {
              *in_RSI = in_RDI->m_pScan_line_1;
            }
          }
          else {
            H1V2ConvertFiltered(in_stack_00000070);
            *in_RSI = in_RDI->m_pScan_line_0;
          }
          break;
        case 4:
          if ((((in_RDI->m_flags & 1) == 0) || (in_RDI->m_image_x_size < 2)) ||
             (in_RDI->m_image_y_size < 2)) {
            if ((in_RDI->m_mcu_lines_left & 1U) == 0) {
              H2V2Convert(in_stack_00000010);
              *in_RSI = in_RDI->m_pScan_line_0;
            }
            else {
              *in_RSI = in_RDI->m_pScan_line_1;
            }
          }
          else {
            if (in_RDI->m_num_buffered_scanlines == 1) {
              *in_RSI = in_RDI->m_pScan_line_1;
            }
            else if (in_RDI->m_num_buffered_scanlines == 0) {
              uVar2 = H2V2ConvertFiltered(in_stack_000001e8);
              in_RDI->m_num_buffered_scanlines = uVar2;
              *in_RSI = in_RDI->m_pScan_line_0;
            }
            in_RDI->m_num_buffered_scanlines = in_RDI->m_num_buffered_scanlines + -1;
          }
        }
        *in_RDX = in_RDI->m_real_dest_bytes_per_scan_line;
        if (!bVar1) {
          in_RDI->m_mcu_lines_left = in_RDI->m_mcu_lines_left + -1;
        }
        in_RDI->m_total_lines_left = in_RDI->m_total_lines_left + -1;
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int jpeg_decoder::decode(const void** pScan_line, uint* pScan_line_len)
	{
		if ((m_error_code) || (!m_ready_flag))
			return JPGD_FAILED;

		if (m_total_lines_left == 0)
			return JPGD_DONE;

		const bool chroma_y_filtering = (m_flags & cFlagLinearChromaFiltering) && ((m_scan_type == JPGD_YH2V2) || (m_scan_type == JPGD_YH1V2)) && (m_image_x_size >= 2) && (m_image_y_size >= 2);

		bool get_another_mcu_row = false;
		bool got_mcu_early = false;
		if (chroma_y_filtering)
		{
			if (m_total_lines_left == m_image_y_size)
				get_another_mcu_row = true;
			else if ((m_mcu_lines_left == 1) && (m_total_lines_left > 1))
			{
				get_another_mcu_row = true;
				got_mcu_early = true;
			}
		}
		else
		{
			get_another_mcu_row = (m_mcu_lines_left == 0);
		}

		if (get_another_mcu_row)
		{
			int status = decode_next_mcu_row();
			if (status != 0)
				return status;
		}

		switch (m_scan_type)
		{
		case JPGD_YH2V2:
		{
			if ((m_flags & cFlagLinearChromaFiltering) && (m_image_x_size >= 2) && (m_image_y_size >= 2))
			{
				if (m_num_buffered_scanlines == 1)
				{
					*pScan_line = m_pScan_line_1;
				}
				else if (m_num_buffered_scanlines == 0)
				{
					m_num_buffered_scanlines = H2V2ConvertFiltered();
					*pScan_line = m_pScan_line_0;
				}

				m_num_buffered_scanlines--;
			}
			else
			{
				if ((m_mcu_lines_left & 1) == 0)
				{
					H2V2Convert();
					*pScan_line = m_pScan_line_0;
				}
				else
					*pScan_line = m_pScan_line_1;
			}

			break;
		}
		case JPGD_YH2V1:
		{
			if ((m_flags & cFlagLinearChromaFiltering) && (m_image_x_size >= 2) && (m_image_y_size >= 2))
				H2V1ConvertFiltered();
			else
				H2V1Convert();
			*pScan_line = m_pScan_line_0;
			break;
		}
		case JPGD_YH1V2:
		{
			if (chroma_y_filtering)
			{
				H1V2ConvertFiltered();
				*pScan_line = m_pScan_line_0;
			}
			else
			{
				if ((m_mcu_lines_left & 1) == 0)
				{
					H1V2Convert();
					*pScan_line = m_pScan_line_0;
				}
				else
					*pScan_line = m_pScan_line_1;
			}

			break;
		}
		case JPGD_YH1V1:
		{
			H1V1Convert();
			*pScan_line = m_pScan_line_0;
			break;
		}
		case JPGD_GRAYSCALE:
		{
			gray_convert();
			*pScan_line = m_pScan_line_0;

			break;
		}
		}

		*pScan_line_len = m_real_dest_bytes_per_scan_line;

		if (!got_mcu_early)
		{
			m_mcu_lines_left--;
		}

		m_total_lines_left--;

		return JPGD_SUCCESS;
	}